

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

type calcGrad(Mesh *mesh,VectorXd *x,double epsilon)

{
  undefined8 uVar1;
  int iVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  Mesh *pMVar10;
  int i_2;
  int iVar11;
  undefined8 *puVar12;
  ulong uVar13;
  long lVar14;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> _Var15;
  VectorXd *in_RDX;
  long lVar16;
  Index extraout_RDX;
  VectorT<double,_3> *__range3;
  uint uVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  long lVar21;
  Index size;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr;
  ulong uVar22;
  PolyConnectivity *this;
  undefined8 *puVar23;
  bool bVar24;
  _Type aiVar25;
  _Type aiVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 in_XMM0_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  _Type aiVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  double dVar43;
  undefined8 uVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined4 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  _Type aiVar58;
  undefined1 auVar59 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar60;
  type tVar61;
  undefined1 auVar62 [12];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1_1;
  value_type e;
  VertexHandle vs [3];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  Vec3d pe2;
  Vec3d pe1;
  Vec3d ue2;
  Vec3d ue1;
  undefined1 local_3f8 [12];
  int iStack_3ec;
  double local_3e8;
  double local_3e0;
  _Type local_3d8 [2];
  double local_3c8;
  _Type local_3b8 [2];
  double local_3a8;
  undefined1 local_398 [24];
  Mesh *local_380;
  undefined1 local_378 [16];
  container local_368;
  _Type aiStack_360;
  undefined8 local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  double local_328;
  PolyConnectivity *local_320;
  EdgeHandle local_318 [2];
  _Type aiStack_310;
  double local_308;
  _Type local_2f8 [4];
  VectorXd *local_2d8;
  int local_2d0 [4];
  int local_2c0;
  int local_2bc;
  _Type local_2b8;
  double dStack_2b0;
  double local_2a8;
  _Type local_298;
  double dStack_290;
  double local_288;
  _Type local_278;
  double dStack_270;
  double local_268;
  double local_258;
  undefined8 uStack_250;
  undefined8 *local_248;
  double local_240;
  double local_238;
  double dStack_230;
  undefined1 local_228 [16];
  double local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  ulong local_1f8;
  uint local_1f0;
  int local_1ec;
  undefined1 local_1e8 [16];
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  double local_1a8;
  double dStack_1a0;
  _Type local_198 [2];
  double local_188;
  _Type local_178 [4];
  long local_158;
  long local_150;
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  _Type local_118;
  double adStack_110 [3];
  _Type local_f8;
  double adStack_f0 [3];
  _Type local_d8;
  _Type aiStack_d0;
  double local_c8;
  _Type local_b8;
  _Type aiStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  undefined8 local_80;
  double local_78;
  ulong local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_380 = mesh;
  local_1c8 = epsilon;
  uStack_1c0 = in_XMM0_Qb;
  initHashMap((Mesh *)x,in_RDX,epsilon);
  auVar48._8_8_ =
       (double)(in_RDX->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
  local_2d8 = in_RDX;
  if (auVar48._8_8_ == 0.0) {
    puVar12 = (undefined8 *)0x0;
  }
  else if (((ulong)auVar48._8_8_ >> 0x3d != 0) ||
          (puVar12 = (undefined8 *)malloc((long)auVar48._8_8_ * 8), puVar12 == (undefined8 *)0x0)) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar12 = std::streambuf::xsgetn;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  uVar22 = (long)auVar48._8_8_ - ((long)auVar48._8_8_ >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)auVar48._8_8_) {
    uVar13 = 2;
    if (2 < (long)uVar22) {
      uVar13 = uVar22;
    }
    memset(puVar12,0,uVar13 * 8);
  }
  if ((long)uVar22 < (long)auVar48._8_8_) {
    memset(puVar12 + ((long)auVar48._8_8_ / 2) * 2,0,
           (long)auVar48._8_8_ * 8 + ((long)auVar48._8_8_ / 2) * -0x10);
  }
  local_208 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)x);
  local_320 = (PolyConnectivity *)x;
  auVar62 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)x);
  auVar59 = local_208;
  if (auVar62 != local_208._0_12_) {
    do {
      local_2d0[2] = -1;
      local_2d0[0] = -1;
      local_2d0[1] = -1;
      uVar42 = *(uint *)(*(long *)&local_320->field_0xf8 + (long)(int)local_208._8_4_ * 4);
      local_208 = auVar59;
      if (-1 < (int)uVar42) {
        lVar14 = *(long *)&local_320->field_0xe0;
        uVar17 = 0;
        piVar19 = local_2d0;
        uVar20 = uVar42;
        do {
          do {
            lVar21 = (long)((int)uVar20 >> 1) * 0x20 + lVar14;
            uVar22 = (ulong)((uVar20 & 1) << 4);
            *piVar19 = *(int *)(uVar22 + 4 + lVar21);
            uVar20 = *(uint *)(uVar22 + 8 + lVar21);
            uVar17 = uVar17 + (uVar20 == uVar42);
            piVar19 = piVar19 + 1;
          } while (uVar20 != uVar42);
        } while (uVar17 != ~uVar42 >> 0x1f);
      }
      lVar14 = (long)local_2d0[0];
      pdVar3 = (local_2d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      local_368._M_elems = *(_Type *)(pdVar3 + lVar14 * 2);
      aiStack_360 = ((_Type *)(pdVar3 + lVar14 * 2))[1];
      local_358 = 0;
      lVar21 = (long)local_2d0[1];
      aiVar58 = *(_Type *)(pdVar3 + lVar21 * 2);
      aiVar39 = ((_Type *)(pdVar3 + lVar21 * 2))[1];
      local_318[0].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)aiVar58[0];
      local_318[1].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)aiVar58[1];
      aiStack_310[0] = aiVar39[0];
      aiStack_310[1] = aiVar39[1];
      local_308 = 0.0;
      lVar16 = (long)local_2d0[2];
      aiVar25 = *(_Type *)(pdVar3 + lVar16 * 2);
      aiVar26 = ((_Type *)(pdVar3 + lVar16 * 2))[1];
      local_2f8[0][0] = aiVar25[0];
      local_2f8[0][1] = aiVar25[1];
      local_2f8[1][0] = aiVar26[0];
      local_2f8[1][1] = aiVar26[1];
      local_2f8[2][0] = 0;
      local_2f8[2][1] = 0;
      local_3e8 = 0.0;
      local_3f8._0_4_ = aiVar58[0];
      local_3f8._4_4_ = aiVar58[1];
      local_3f8._8_4_ = aiVar39[0];
      iStack_3ec = aiVar39[1];
      lVar18 = 0;
      do {
        *(double *)(local_3f8 + lVar18 * 8) =
             *(double *)(local_3f8 + lVar18 * 8) - *(double *)(&local_368)[lVar18]._M_elems;
        dVar27 = local_3e8;
        aiVar58 = stack0xfffffffffffffc10;
        uVar47 = local_3f8._0_8_;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      local_a8 = local_3e8;
      local_b8[0] = local_3f8._0_4_;
      local_b8[1] = local_3f8._4_4_;
      aiStack_b0[0] = local_3f8._8_4_;
      aiStack_b0[1] = iStack_3ec;
      local_3e8 = 0.0;
      local_3f8._0_4_ = aiVar25[0];
      local_3f8._4_4_ = aiVar25[1];
      local_3f8._8_4_ = aiVar26[0];
      iStack_3ec = aiVar26[1];
      lVar18 = 0;
      do {
        *(double *)(local_3f8 + lVar18 * 8) =
             *(double *)(local_3f8 + lVar18 * 8) - *(double *)(&local_368)[lVar18]._M_elems;
        dVar28 = local_3e8;
        aiVar39 = stack0xfffffffffffffc10;
        uVar9 = local_3f8._0_8_;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      local_c8 = local_3e8;
      local_d8[0] = local_3f8._0_4_;
      local_d8[1] = local_3f8._4_4_;
      aiStack_d0[0] = local_3f8._8_4_;
      aiStack_d0[1] = iStack_3ec;
      lVar18 = *(long *)(*(long *)(*(long *)&local_320->field_0x10 +
                                  (long)*(int *)(local_320 + 1) * 8) + 0x30);
      uVar1 = *(undefined8 *)(lVar18 + lVar14 * 0xc);
      aiVar25 = (_Type)(double)(float)uVar1;
      local_278[0] = aiVar25[0];
      local_278[1] = aiVar25[1];
      dStack_270 = (double)(float)((ulong)uVar1 >> 0x20);
      local_268 = (double)*(float *)(lVar18 + 8 + lVar14 * 0xc);
      uVar1 = *(undefined8 *)(lVar18 + lVar21 * 0xc);
      aiVar25 = (_Type)(double)(float)uVar1;
      dStack_290 = (double)(float)((ulong)uVar1 >> 0x20);
      local_288 = (double)*(float *)(lVar18 + 8 + lVar21 * 0xc);
      local_298[0] = aiVar25[0];
      local_298[1] = aiVar25[1];
      uVar1 = *(undefined8 *)(lVar18 + lVar16 * 0xc);
      aiVar26 = (_Type)(double)(float)uVar1;
      dStack_2b0 = (double)(float)((ulong)uVar1 >> 0x20);
      local_2a8 = (double)*(float *)(lVar18 + 8 + lVar16 * 0xc);
      local_2b8[0] = aiVar26[0];
      local_2b8[1] = aiVar26[1];
      local_3e8 = local_288;
      local_3f8._0_4_ = aiVar25[0];
      local_3f8._4_4_ = aiVar25[1];
      stack0xfffffffffffffc10 = (_Type)dStack_290;
      lVar14 = 0;
      do {
        *(double *)(local_3f8 + lVar14 * 8) =
             *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      adStack_f0[1] = local_3e8;
      local_f8[0] = local_3f8._0_4_;
      local_f8[1] = local_3f8._4_4_;
      adStack_f0[0] = (double)stack0xfffffffffffffc10;
      local_3e8 = local_2a8;
      local_3f8._0_4_ = aiVar26[0];
      local_3f8._4_4_ = aiVar26[1];
      stack0xfffffffffffffc10 = (_Type)dStack_2b0;
      lVar14 = 0;
      do {
        *(double *)(local_3f8 + lVar14 * 8) =
             *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      adStack_110[1] = local_3e8;
      local_118[0] = local_3f8._0_4_;
      local_118[1] = local_3f8._4_4_;
      adStack_110[0] = (double)stack0xfffffffffffffc10;
      aiVar25 = (_Type)(dVar28 * (double)aiVar58 - dVar27 * (double)aiVar39);
      aiVar26 = (_Type)((double)uVar9 * dVar27 - (double)uVar47 * dVar28);
      local_3f8._0_4_ = aiVar25[0];
      local_3f8._4_4_ = aiVar25[1];
      local_3f8._8_4_ = aiVar26[0];
      iStack_3ec = aiVar26[1];
      local_3e8 = (double)uVar47 * (double)aiVar39 - (double)uVar9 * (double)aiVar58;
      dVar27 = (double)aiVar25 * (double)aiVar25;
      lVar14 = 8;
      do {
        dVar27 = dVar27 + *(double *)(local_3f8 + lVar14) * *(double *)(local_3f8 + lVar14);
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x18);
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        dVar27 = SQRT(dVar27);
      }
      dVar27 = dVar27 * 0.5;
      if ((dVar27 != 0.0) || (NAN(dVar27))) {
        local_338._0_8_ = dVar27;
        local_3f8._0_8_ = adStack_110[1] * adStack_f0[0] - adStack_f0[1] * adStack_110[0];
        stack0xfffffffffffffc10 =
             (_Type)((double)local_118 * adStack_f0[1] - (double)local_f8 * adStack_110[1]);
        local_3e8 = (double)local_f8 * adStack_110[0] - (double)local_118 * adStack_f0[0];
        dVar27 = (double)local_3f8._0_8_ * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          dVar27 = dVar27 + *(double *)(local_3f8 + lVar14) * *(double *)(local_3f8 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if (dVar27 < 0.0) {
          local_3e0 = sqrt(dVar27);
        }
        else {
          local_3e0 = SQRT(dVar27);
        }
        local_3e8 = local_288;
        local_3f8._0_4_ = local_298[0];
        local_3f8._4_4_ = local_298[1];
        stack0xfffffffffffffc10 = (_Type)dStack_290;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3a8 = local_3e8;
        local_3b8[0][0] = local_3f8._0_4_;
        local_3b8[0][1] = local_3f8._4_4_;
        local_3b8[1] = stack0xfffffffffffffc10;
        local_3e8 = local_2a8;
        local_3f8._0_4_ = local_2b8[0];
        local_3f8._4_4_ = local_2b8[1];
        stack0xfffffffffffffc10 = (_Type)dStack_2b0;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[0][0] = local_3f8._0_4_;
        local_3d8[0][1] = local_3f8._4_4_;
        local_3d8[1] = stack0xfffffffffffffc10;
        local_398._0_8_ = (double)uVar47 * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          local_398._0_8_ =
               (double)local_398._0_8_ +
               *(double *)((long)local_3b8[0] + lVar14) * *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3e8 = local_288;
        local_3f8._0_4_ = local_298[0];
        local_3f8._4_4_ = local_298[1];
        stack0xfffffffffffffc10 = (_Type)dStack_290;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
          dVar28 = local_3e8;
          dVar27 = (double)stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_398._8_8_ = 0;
        local_3e8 = local_2a8;
        local_3f8._0_4_ = local_2b8[0];
        local_3f8._4_4_ = local_2b8[1];
        stack0xfffffffffffffc10 = (_Type)dStack_2b0;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_278 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar34 = (double)uVar47 * (double)stack0xfffffffffffffc10;
        dVar43 = (double)local_3f8._0_8_ * dVar27;
        auVar55._8_8_ = (double)local_3f8._0_8_ * dVar28;
        local_3f8._0_8_ = local_3e8 * dVar27 - dVar28 * (double)stack0xfffffffffffffc10;
        stack0xfffffffffffffc10 = (_Type)(auVar55._8_8_ - (double)uVar47 * local_3e8);
        local_3e8 = dVar34 - dVar43;
        dVar27 = (double)local_3f8._0_8_ * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          dVar27 = dVar27 + *(double *)(local_3f8 + lVar14) * *(double *)(local_3f8 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if (dVar27 < 0.0) {
          local_258 = sqrt(dVar27);
        }
        else {
          local_258 = SQRT(dVar27);
        }
        local_3e8 = local_2a8;
        local_3f8._0_4_ = local_2b8[0];
        local_3f8._4_4_ = local_2b8[1];
        stack0xfffffffffffffc10 = (_Type)dStack_2b0;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_298 + lVar14 * 2);
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3e0 = local_3e0 * 0.5;
        local_3a8 = local_3e8;
        local_3b8[0][0] = local_3f8._0_4_;
        local_3b8[0][1] = local_3f8._4_4_;
        local_3b8[1] = stack0xfffffffffffffc10;
        local_3e8 = local_268;
        local_3f8._0_4_ = local_278[0];
        local_3f8._4_4_ = local_278[1];
        stack0xfffffffffffffc10 = (_Type)dStack_270;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_298 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[0][0] = local_3f8._0_4_;
        local_3d8[0][1] = local_3f8._4_4_;
        local_3d8[1] = stack0xfffffffffffffc10;
        local_128 = (double)uVar47 * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          local_128 = local_128 +
                      *(double *)((long)local_3b8[0] + lVar14) *
                      *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3e8 = local_2a8;
        local_3f8._0_4_ = local_2b8[0];
        local_3f8._4_4_ = local_2b8[1];
        stack0xfffffffffffffc10 = (_Type)dStack_2b0;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_298 + lVar14 * 2);
          dVar28 = local_3e8;
          dVar27 = (double)stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3e8 = local_268;
        local_3f8._0_4_ = local_278[0];
        local_3f8._4_4_ = local_278[1];
        stack0xfffffffffffffc10 = (_Type)dStack_270;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_298 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar34 = (double)uVar47 * (double)stack0xfffffffffffffc10;
        dVar43 = (double)local_3f8._0_8_ * dVar27;
        auVar55._8_8_ = (double)local_3f8._0_8_ * dVar28;
        local_3f8._0_8_ = local_3e8 * dVar27 - dVar28 * (double)stack0xfffffffffffffc10;
        stack0xfffffffffffffc10 = (_Type)(auVar55._8_8_ - (double)uVar47 * local_3e8);
        local_3e8 = dVar34 - dVar43;
        dVar27 = (double)local_3f8._0_8_ * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          dVar27 = dVar27 + *(double *)(local_3f8 + lVar14) * *(double *)(local_3f8 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if (dVar27 < 0.0) {
          local_328 = sqrt(dVar27);
        }
        else {
          local_328 = SQRT(dVar27);
        }
        local_3e8 = local_288;
        local_3f8._0_4_ = local_298[0];
        local_3f8._4_4_ = local_298[1];
        stack0xfffffffffffffc10 = (_Type)dStack_290;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_2b8 + lVar14 * 2);
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_398._0_8_ = (double)local_398._0_8_ / local_258;
        local_3a8 = local_3e8;
        local_3b8[0][0] = local_3f8._0_4_;
        local_3b8[0][1] = local_3f8._4_4_;
        local_3b8[1] = stack0xfffffffffffffc10;
        local_3e8 = local_268;
        local_3f8._0_4_ = local_278[0];
        local_3f8._4_4_ = local_278[1];
        stack0xfffffffffffffc10 = (_Type)dStack_270;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_2b8 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[0][0] = local_3f8._0_4_;
        local_3d8[0][1] = local_3f8._4_4_;
        local_3d8[1] = stack0xfffffffffffffc10;
        local_258 = (double)uVar47 * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          local_258 = local_258 +
                      *(double *)((long)local_3b8[0] + lVar14) *
                      *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3e8 = local_288;
        local_3f8._0_4_ = local_298[0];
        local_3f8._4_4_ = local_298[1];
        stack0xfffffffffffffc10 = (_Type)dStack_290;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_2b8 + lVar14 * 2);
          dVar28 = local_3e8;
          dVar27 = (double)stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3e8 = local_268;
        local_3f8._0_4_ = local_278[0];
        local_3f8._4_4_ = local_278[1];
        stack0xfffffffffffffc10 = (_Type)dStack_270;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_2b8 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar34 = (double)uVar47 * (double)stack0xfffffffffffffc10;
        dVar43 = (double)local_3f8._0_8_ * dVar27;
        auVar55._8_8_ = (double)local_3f8._0_8_ * dVar28;
        local_3f8._0_8_ = local_3e8 * dVar27 - dVar28 * (double)stack0xfffffffffffffc10;
        stack0xfffffffffffffc10 = (_Type)(auVar55._8_8_ - (double)uVar47 * local_3e8);
        local_3e8 = dVar34 - dVar43;
        dVar27 = (double)local_3f8._0_8_ * (double)local_3f8._0_8_;
        lVar14 = 8;
        do {
          dVar27 = dVar27 + *(double *)(local_3f8 + lVar14) * *(double *)(local_3f8 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        uStack_250 = 0;
        if (dVar27 < 0.0) {
          dVar27 = sqrt(dVar27);
        }
        else {
          dVar27 = SQRT(dVar27);
        }
        local_1d8 = local_3e0 * local_3e0;
        local_1a8 = (double)local_338._0_8_ * (double)local_338._0_8_;
        local_218 = local_1d8 / local_1a8;
        uStack_210 = 0;
        dVar28 = (double)local_d8 * (double)local_d8;
        lVar14 = 0;
        do {
          dVar28 = dVar28 + *(double *)((long)aiStack_d0 + lVar14) *
                            *(double *)((long)aiStack_d0 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        local_348._8_8_ = 0;
        local_348._0_4_ = local_d8[0];
        local_348._4_4_ = local_d8[1];
        uStack_1d0 = 0;
        local_228._0_8_ = dVar27;
        if (dVar28 < 0.0) {
          uStack_210 = 0;
          dVar28 = sqrt(dVar28);
        }
        else {
          dVar28 = SQRT(dVar28);
        }
        local_378._0_8_ = dVar28;
        local_258 = local_258 / (double)local_228._0_8_;
        dVar27 = (double)local_f8 * (double)local_f8;
        lVar14 = 0;
        do {
          dVar27 = dVar27 + *(double *)((long)adStack_f0 + lVar14) *
                            *(double *)((long)adStack_f0 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        local_218 = local_218 + 1.0;
        local_228._0_4_ = local_f8[0];
        local_228._4_4_ = local_f8[1];
        if (dVar27 < 0.0) {
          local_238 = sqrt(dVar27);
        }
        else {
          local_238 = SQRT(dVar27);
        }
        local_1e8._0_4_ = local_b8[0];
        local_1e8._4_4_ = local_b8[1];
        dVar27 = (double)local_b8 * (double)local_b8;
        lVar14 = 0;
        do {
          dVar27 = dVar27 + *(double *)((long)aiStack_b0 + lVar14) *
                            *(double *)((long)aiStack_b0 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        if (dVar27 < 0.0) {
          dVar27 = sqrt(dVar27);
        }
        else {
          dVar27 = SQRT(dVar27);
        }
        dVar28 = (double)local_118 * (double)local_118;
        lVar14 = 0;
        do {
          dVar28 = dVar28 + *(double *)((long)adStack_110 + lVar14) *
                            *(double *)((long)adStack_110 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        if (dVar28 < 0.0) {
          local_378._0_8_ = (double)local_378._0_8_ * (double)local_378._0_8_;
          local_1b8._0_4_ = local_118[0];
          local_1b8._4_4_ = local_118[1];
          local_138 = dVar27;
          dVar28 = sqrt(dVar28);
          aiVar58 = (_Type)local_1b8._0_8_;
          dVar27 = local_138;
          auVar55._8_8_ = (double)local_378._0_8_;
        }
        else {
          dVar28 = SQRT(dVar28);
          aiVar58 = local_118;
          auVar55._8_8_ = (double)local_378._0_8_ * (double)local_378._0_8_;
        }
        dVar34 = local_128 / local_328;
        dVar43 = (double)local_348._0_8_ * (double)local_1e8._0_8_;
        lVar14 = 0;
        do {
          dVar43 = dVar43 + *(double *)((long)aiStack_d0 + lVar14) *
                            *(double *)((long)aiStack_b0 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        dVar57 = (double)local_228._0_8_ * (double)aiVar58;
        lVar14 = 0;
        do {
          dVar57 = dVar57 + *(double *)((long)adStack_110 + lVar14) *
                            *(double *)((long)adStack_f0 + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x10);
        local_3e8 = (double)local_2f8[2];
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_318 + lVar14 * 2);
          aiVar58 = stack0xfffffffffffffc10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_318 + lVar14 * 2);
          aiVar39 = (_Type)local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar29 = -(double)aiVar58;
        local_3b8[1][0] = local_3f8._0_4_;
        local_3b8[1][1] = local_3f8._4_4_;
        local_3a8 = 0.0;
        local_3e8 = (double)local_358;
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(local_318 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3f8._0_8_ = (double)local_3f8._0_8_ * dVar29;
        lVar14 = 8;
        do {
          local_3f8._0_8_ =
               (double)local_3f8._0_8_ +
               *(double *)((long)local_3b8[0] + lVar14) * *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if ((double)local_3f8._0_8_ < 0.0) {
          dVar29 = -dVar29;
          aiVar39 = (_Type)((ulong)aiVar39 ^ 0x8000000000000000);
        }
        dVar27 = (dVar43 * -2.0 * dVar57 +
                 auVar55._8_8_ * local_238 * local_238 + dVar28 * dVar28 * dVar27 * dVar27) /
                 (local_3e0 * 4.0);
        dVar28 = -local_1d8 / (local_1a8 * (double)local_338._0_8_);
        local_3e8 = local_308;
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) = *(double *)(local_3f8 + lVar14) * -local_258;
          auVar55._8_8_ = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3c8 = local_3e8;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3e8 = (double)local_2f8[2];
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) = *(double *)(local_3f8 + lVar14) * dVar34;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_178[2] = (_Type)local_3e8;
        local_178[0][0] = local_3f8._0_4_;
        local_178[0][1] = local_3f8._4_4_;
        local_178[1][0] = local_3f8._8_4_;
        local_178[1][1] = iStack_3ec;
        local_3e8 = auVar55._8_8_;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - (double)local_178[lVar14];
          auVar55._8_8_ = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3a8 = local_3e8;
        local_3b8[1][0] = local_3f8._8_4_;
        local_3b8[1][1] = iStack_3ec;
        local_3e8 = (double)local_358;
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) = *(double *)(local_3f8 + lVar14) * (dVar34 + local_258);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_188 = local_3e8;
        local_198[0][0] = local_3f8._0_4_;
        local_198[0][1] = local_3f8._4_4_;
        local_198[1][0] = local_3f8._8_4_;
        local_198[1][1] = iStack_3ec;
        local_3e8 = auVar55._8_8_;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               (double)local_198[lVar14] + *(double *)(local_3f8 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        auVar55._8_8_ = (double)(puVar12 + (long)local_2d0[0] * 2)[1];
        puVar12[(long)local_2d0[0] * 2] =
             (double)puVar12[(long)local_2d0[0] * 2] +
             dVar29 * dVar28 * dVar27 + (double)local_3f8._0_8_ * local_218;
        (puVar12 + (long)local_2d0[0] * 2)[1] =
             auVar55._8_8_ +
             (double)aiVar39 * dVar28 * dVar27 + (double)stack0xfffffffffffffc10 * local_218;
        local_3e8 = (double)local_358;
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - (double)local_2f8[lVar14];
          aiVar58 = stack0xfffffffffffffc10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - (double)local_2f8[lVar14];
          aiVar39 = (_Type)local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        auVar55._8_8_ = -(double)aiVar58;
        local_3b8[1][0] = local_3f8._0_4_;
        local_3b8[1][1] = local_3f8._4_4_;
        local_3a8 = 0.0;
        local_3e8 = local_308;
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(&local_368)[lVar14]._M_elems;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3f8._0_8_ = (double)local_3f8._0_8_ * auVar55._8_8_;
        lVar14 = 8;
        do {
          local_3f8._0_8_ =
               (double)local_3f8._0_8_ +
               *(double *)((long)local_3b8[0] + lVar14) * *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if ((double)local_3f8._0_8_ < 0.0) {
          auVar55._8_8_ = -auVar55._8_8_;
          aiVar39 = (_Type)((ulong)aiVar39 ^ 0x8000000000000000);
        }
        local_3e8 = (double)local_358;
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) = *(double *)(local_3f8 + lVar14) * -local_258;
          dVar43 = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3c8 = local_3e8;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3e8 = (double)local_2f8[2];
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) =
               *(double *)(local_3f8 + lVar14) * (double)local_398._0_8_;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_178[2] = (_Type)local_3e8;
        local_178[0][0] = local_3f8._0_4_;
        local_178[0][1] = local_3f8._4_4_;
        local_178[1][0] = local_3f8._8_4_;
        local_178[1][1] = iStack_3ec;
        local_3e8 = dVar43;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - (double)local_178[lVar14];
          dVar43 = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3a8 = local_3e8;
        local_3b8[1][0] = local_3f8._8_4_;
        local_3b8[1][1] = iStack_3ec;
        local_3e8 = local_308;
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) =
               *(double *)(local_3f8 + lVar14) * (local_258 + (double)local_398._0_8_);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_188 = local_3e8;
        local_198[0][0] = local_3f8._0_4_;
        local_198[0][1] = local_3f8._4_4_;
        local_198[1][0] = local_3f8._8_4_;
        local_198[1][1] = iStack_3ec;
        local_3e8 = dVar43;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               (double)local_198[lVar14] + *(double *)(local_3f8 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar43 = (double)(puVar12 + (long)local_2d0[1] * 2)[1];
        puVar12[(long)local_2d0[1] * 2] =
             (double)puVar12[(long)local_2d0[1] * 2] +
             auVar55._8_8_ * dVar28 * dVar27 + (double)local_3f8._0_8_ * local_218;
        (puVar12 + (long)local_2d0[1] * 2)[1] =
             dVar43 + (double)aiVar39 * dVar28 * dVar27 +
                      (double)stack0xfffffffffffffc10 * local_218;
        local_3e8 = local_308;
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(&local_368)[lVar14]._M_elems;
          aiVar58 = stack0xfffffffffffffc10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(&local_368)[lVar14]._M_elems;
          aiVar39 = (_Type)local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        auVar55._8_8_ = -(double)aiVar58;
        local_3b8[1][0] = local_3f8._0_4_;
        local_3b8[1][1] = local_3f8._4_4_;
        local_3a8 = 0.0;
        local_3e8 = (double)local_2f8[2];
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - *(double *)(&local_368)[lVar14]._M_elems;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3c8 = local_3e8;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3f8._0_8_ = (double)local_3f8._0_8_ * auVar55._8_8_;
        lVar14 = 8;
        do {
          local_3f8._0_8_ =
               (double)local_3f8._0_8_ +
               *(double *)((long)local_3b8[0] + lVar14) * *(double *)((long)local_3d8[0] + lVar14);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        if ((double)local_3f8._0_8_ < 0.0) {
          auVar55._8_8_ = -auVar55._8_8_;
          aiVar39 = (_Type)((ulong)aiVar39 ^ 0x8000000000000000);
        }
        local_3e8 = local_308;
        local_3f8._0_4_ = local_318[0].super_BaseHandle.idx_;
        local_3f8._4_4_ = local_318[1].super_BaseHandle.idx_;
        local_3f8._8_4_ = aiStack_310[0];
        iStack_3ec = aiStack_310[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) =
               *(double *)(local_3f8 + lVar14) * -(double)local_398._0_8_;
          dVar43 = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_3c8 = local_3e8;
        local_3d8[0][0] = local_3f8._0_4_;
        local_3d8[0][1] = local_3f8._4_4_;
        local_3d8[1][0] = local_3f8._8_4_;
        local_3d8[1][1] = iStack_3ec;
        local_3e8 = (double)local_358;
        local_3f8._0_4_ = local_368._M_elems[0];
        local_3f8._4_4_ = local_368._M_elems[1];
        local_3f8._8_4_ = aiStack_360[0];
        iStack_3ec = aiStack_360[1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) = *(double *)(local_3f8 + lVar14) * dVar34;
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_178[2] = (_Type)local_3e8;
        local_178[0][0] = local_3f8._0_4_;
        local_178[0][1] = local_3f8._4_4_;
        local_178[1][0] = local_3f8._8_4_;
        local_178[1][1] = iStack_3ec;
        local_3e8 = dVar43;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               *(double *)(local_3f8 + lVar14 * 8) - (double)local_178[lVar14];
          dVar43 = local_3e8;
          aiVar58 = stack0xfffffffffffffc10;
          uVar47 = local_3f8._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_3a8 = local_3e8;
        local_3b8[0][0] = local_3f8._0_4_;
        local_3b8[0][1] = local_3f8._4_4_;
        local_3b8[1][0] = local_3f8._8_4_;
        local_3b8[1][1] = iStack_3ec;
        local_3e8 = (double)local_2f8[2];
        local_3f8._0_4_ = local_2f8[0][0];
        local_3f8._4_4_ = local_2f8[0][1];
        local_3f8._8_4_ = local_2f8[1][0];
        iStack_3ec = local_2f8[1][1];
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14) =
               *(double *)(local_3f8 + lVar14) * ((double)local_398._0_8_ + dVar34);
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x18);
        local_188 = local_3e8;
        local_198[0][0] = local_3f8._0_4_;
        local_198[0][1] = local_3f8._4_4_;
        local_198[1][0] = local_3f8._8_4_;
        local_198[1][1] = iStack_3ec;
        local_3e8 = dVar43;
        local_3f8._0_8_ = uVar47;
        stack0xfffffffffffffc10 = aiVar58;
        lVar14 = 0;
        do {
          *(double *)(local_3f8 + lVar14 * 8) =
               (double)local_198[lVar14] + *(double *)(local_3f8 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        dVar34 = (double)(puVar12 + (long)local_2d0[2] * 2)[1];
        puVar12[(long)local_2d0[2] * 2] =
             (double)puVar12[(long)local_2d0[2] * 2] +
             dVar27 * dVar28 * auVar55._8_8_ + local_218 * (double)local_3f8._0_8_;
        (puVar12 + (long)local_2d0[2] * 2)[1] =
             dVar34 + dVar27 * dVar28 * (double)aiVar39 +
                      local_218 * (double)stack0xfffffffffffffc10;
        dVar27 = (double)local_338._0_8_;
      }
      else {
        *puVar12 = 0x7ff0000000000000;
        *(undefined8 **)
         &(local_380->super_Mesh).
          super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
          .super_PolyConnectivity = puVar12;
        *(double *)
         &(local_380->super_Mesh).
          super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
          .super_PolyConnectivity.field_0x8 = auVar48._8_8_;
        auVar48._8_8_ = 0.0;
        puVar12 = (undefined8 *)0x0;
      }
      auVar8._8_8_ = local_88;
      auVar8._0_8_ = local_80;
      auVar31._8_4_ = local_3f8._8_4_;
      auVar31._12_4_ = iStack_3ec;
      auVar31._0_8_ = local_3f8._0_8_;
      if ((dVar27 == 0.0) && (!NAN(dVar27))) goto LAB_0013d2b3;
      local_208._8_4_ = local_208._8_4_ + 1;
      if (local_208._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_208);
      }
      auVar59._8_8_ = local_208._8_8_;
      auVar59._0_8_ = local_208._0_8_;
      auVar6._8_4_ = local_208._8_4_;
      auVar6._0_8_ = local_208._0_8_;
    } while (auVar62 != auVar6);
  }
  this = local_320;
  local_208 = auVar59;
  _local_3f8 = OpenMesh::PolyConnectivity::edges_begin(local_320);
  auVar59 = OpenMesh::PolyConnectivity::edges_end(this);
  auVar8._8_8_ = local_88;
  auVar8._0_8_ = local_80;
  bVar24 = true;
  if (local_3f8._8_4_ != auVar59._8_4_ || local_3f8._0_8_ != auVar59._0_8_) {
    local_58 = local_1c8;
    dStack_50 = local_1c8;
    local_248 = *(undefined8 **)
                 &(local_380->super_Mesh).
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                  .super_PolyConnectivity;
    local_240 = *(double *)
                 &(local_380->super_Mesh).
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                  .super_PolyConnectivity.field_0x8;
    auVar7 = _local_3f8;
    auVar8 = auVar59;
    do {
      local_318[0].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_3f8._8_4_;
      lVar14 = *(long *)&this->field_0xe0;
      lVar21 = ((long)((ulong)(uint)local_3f8._8_4_ << 0x21) >> 0x21) * 0x20;
      if ((*(int *)(lVar14 + lVar21) < 0) || (*(int *)(lVar14 + 0x10 + lVar21) < 0)) {
        iVar2 = *(int *)(lVar14 + lVar21 + 4);
        lVar18 = (long)iVar2;
        local_258 = (double)(long)*(int *)(lVar14 + lVar21 + 0x14);
        local_158 = lVar18 * 2;
        pdVar3 = (local_2d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        lVar14 = (long)((int)local_158 + 1);
        dVar27 = pdVar3[lVar18 * 2];
        dVar28 = (pdVar3 + lVar18 * 2)[1];
        local_150 = (long)local_258 * 2;
        lVar16 = (long)((int)local_150 + 1);
        auVar59 = *(undefined1 (*) [16])(pdVar3 + (long)local_258 * 2);
        auVar55._8_8_ = auVar59._0_8_;
        dVar34 = auVar59._8_8_;
        auVar30._0_8_ =
             ~-(ulong)(auVar55._8_8_ < dVar27) & (ulong)pdVar3[lVar18 * 2] |
             -(ulong)(auVar55._8_8_ < dVar27) & (ulong)pdVar3[(long)local_258 * 2];
        auVar30._8_8_ =
             ~-(ulong)(dVar27 < auVar55._8_8_) & (ulong)pdVar3[lVar18 * 2] |
             (ulong)pdVar3[(long)local_258 * 2] & -(ulong)(dVar27 < auVar55._8_8_);
        auVar5._8_8_ = dStack_50;
        auVar5._0_8_ = local_58;
        auVar31 = divpd(auVar30,auVar5);
        uVar42 = (uint)(auVar31._0_8_ + -1.0);
        local_1ec = (int)(auVar31._8_8_ + 1.0);
        lVar21 = lVar14;
        if (dVar34 < dVar28) {
          lVar21 = lVar16;
        }
        local_1f8 = (ulong)uVar42;
        if ((int)uVar42 <= local_1ec) {
          local_1a8 = auVar55._8_8_ - dVar27;
          local_148._8_8_ = dVar34 - dVar28;
          local_228._8_8_ = local_148._8_8_;
          local_228._0_8_ = local_148._8_8_;
          local_1f0 = (uint)(pdVar3[lVar21] / local_1c8 + -1.0);
          if (dVar28 < dVar34) {
            lVar14 = lVar16;
          }
          local_2c0 = (int)(pdVar3[lVar14] / local_1c8 + 1.0);
          local_3e0 = local_148._8_8_ * local_148._8_8_ + local_1a8 * local_1a8;
          local_138 = dVar27 - auVar55._8_8_;
          dStack_130 = dVar28 - dVar34;
          local_148._0_8_ = local_1a8 * local_1a8 + local_148._8_8_ * local_148._8_8_;
          local_218 = SQRT(local_3e0);
          local_78 = SQRT((double)local_148._0_8_);
          local_1b8 = auVar59;
          dStack_1a0 = local_148._8_8_;
          local_128 = dVar27;
          dStack_120 = dVar28;
          local_68 = dStack_130;
          dStack_60 = dStack_130;
          do {
            uVar42 = local_1f0;
            if ((int)local_1f0 <= local_2c0) {
              do {
                local_88 = auVar8._8_8_;
                local_80 = auVar8._0_8_;
                local_368._M_elems[1] = uVar42;
                local_368._M_elems[0] = (int)local_1f8;
                _local_3f8 = auVar7;
                pVar60 = std::
                         _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         ::equal_range(&neighbors._M_h,(key_type *)&local_368);
                _Var15._M_cur =
                     (__node_type *)
                     pVar60.first.
                     super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                     ._M_cur;
                local_2bc = 0;
                dVar27 = auVar48._8_8_;
                puVar23 = puVar12;
                local_70 = (ulong)uVar42;
                while( true ) {
                  bVar24 = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                            )_Var15._M_cur !=
                           pVar60.second.
                           super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                  ;
                  auVar48._8_8_ = dVar27;
                  puVar12 = puVar23;
                  auVar7 = _local_3f8;
                  if (!bVar24) break;
                  iVar11 = *(int *)((long)&((_Var15._M_cur)->
                                           super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                           ._M_storage._M_storage + 8);
                  if ((iVar11 != iVar2) && (iVar11 != local_258._0_4_)) {
                    local_398._0_16_ =
                         *(undefined1 (*) [16])
                          ((local_2d8->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data + (long)iVar11 * 2);
                    dVar28 = local_218;
                    if (local_3e0 < 0.0) {
                      dVar28 = sqrt(local_3e0);
                    }
                    local_338._0_8_ = dVar28;
                    local_368._M_elems[0] =
                         *(int *)((long)&((_Var15._M_cur)->
                                         super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                         ._M_storage._M_storage + 8);
                    dVar28 = getDistance((Mesh *)local_320,local_2d8,local_318,
                                         (VertexHandle *)&local_368);
                    auVar7 = _local_3f8;
                    if ((dVar28 != 0.0) || (NAN(dVar28))) {
                      auVar55._8_8_ = local_1c8 / dVar28 + -1.0;
                      if (auVar55._8_8_ <= 0.0) {
                        auVar55._8_8_ = 0.0;
                      }
                      auVar40._8_8_ = uStack_1c0;
                      auVar40._0_8_ = auVar55._8_8_;
                      if (((auVar55._8_8_ != 0.0) || (NAN(auVar55._8_8_))) &&
                         (iVar11 = *(int *)((long)&((_Var15._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                                  ._M_storage._M_storage + 8), iVar11 != -1)) {
                        auVar55._0_8_ = (double)local_398._0_8_ - local_128;
                        auVar55._8_8_ = (double)local_398._8_8_ - dStack_120;
                        dVar34 = (auVar55._8_8_ * (double)local_228._0_8_ +
                                 local_1a8 * auVar55._0_8_) / (double)local_338._0_8_;
                        lVar14 = (long)iVar11;
                        pdVar3 = (local_2d8->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_data + lVar14 * 2;
                        local_48 = *pdVar3;
                        dStack_40 = pdVar3[1];
                        auVar48._0_8_ = local_48 - local_128;
                        auVar48._8_8_ = dStack_40 - dStack_120;
                        dVar34 = (auVar48._8_8_ * auVar48._8_8_ + auVar48._0_8_ * auVar48._0_8_) -
                                 dVar34 * dVar34;
                        local_378 = auVar40;
                        local_328 = dVar28;
                        local_238 = auVar48._8_8_;
                        dStack_230 = auVar48._8_8_;
                        local_1d8 = dVar27;
                        if (dVar34 < 0.0) {
                          local_348 = auVar48;
                          local_1e8 = auVar55;
                          local_98 = auVar55._8_8_;
                          dStack_90 = auVar55._8_8_;
                          local_338._0_8_ = sqrt(dVar34);
                          auVar59 = local_348;
                          auVar31 = local_1e8;
                          auVar48._8_8_ = extraout_XMM0_Qb;
                          auVar55._8_8_ = local_98;
                          dVar27 = dStack_90;
                        }
                        else {
                          local_338._0_8_ = SQRT(dVar34);
                          auVar59 = auVar48;
                          auVar31 = auVar55;
                          dVar27 = auVar55._8_8_;
                        }
                        local_338._8_8_ = auVar48._8_8_;
                        auVar53._0_8_ = (double)local_398._0_8_ - (double)local_1b8._0_8_;
                        auVar53._8_8_ = (double)local_398._8_8_ - (double)local_1b8._8_8_;
                        if (0.0 <= auVar53._8_8_ * local_68 + auVar53._0_8_ * local_138) {
                          auVar48._8_8_ = auVar31._0_8_;
                          if (auVar55._8_8_ * (double)local_228._0_8_ + auVar48._8_8_ * local_1a8 <
                              0.0) {
                            auVar55._8_8_ =
                                 auVar55._8_8_ * auVar55._8_8_ + auVar48._8_8_ * auVar48._8_8_;
                            auVar48._8_8_ = SQRT(auVar55._8_8_);
                            uVar47 = 0;
                            dVar28 = auVar48._8_8_;
                            local_1e8 = auVar31;
                            if (auVar55._8_8_ < 0.0) {
                              local_398._8_8_ = 0;
                              local_398._0_8_ = auVar48._8_8_;
                              local_98 = auVar55._8_8_;
                              dStack_90 = dVar27;
                              auVar48._8_8_ = sqrt(auVar55._8_8_);
                              dVar28 = (double)local_398._0_8_;
                              auVar55._8_8_ = local_98;
                              uVar47 = extraout_XMM0_Qb_01;
                            }
                            dVar27 = (double)local_378._0_8_ * -2.0;
                            if (auVar55._8_8_ < 0.0) {
                              local_378._0_8_ = (double)local_378._0_8_ * -2.0;
                              local_398._8_8_ = uVar47;
                              local_398._0_8_ = auVar48._8_8_;
                              dVar28 = sqrt(auVar55._8_8_);
                              auVar48._8_8_ = (double)local_398._0_8_;
                              dVar27 = (double)local_378._0_8_;
                            }
                            auVar49._8_8_ = auVar48._8_8_;
                            auVar49._0_8_ = auVar48._8_8_;
                            auVar59 = divpd(local_1e8,auVar49);
                            dVar27 = dVar27 * local_1c8;
                            auVar45._0_8_ = (double)local_338._0_8_ * (double)local_338._0_8_;
                            auVar37._8_8_ = dVar28;
                            auVar37._0_8_ = dVar28;
                            auVar31 = divpd(local_1e8,auVar37);
                            auVar56._0_8_ = auVar31._0_8_ * dVar27;
                            auVar56._8_8_ = auVar31._8_8_ * dVar27;
                            auVar45._8_8_ = auVar45._0_8_;
                            auVar31 = divpd(auVar56,auVar45);
                            auVar36._0_8_ = (double)puVar23[local_158] - auVar31._0_8_;
                            auVar36._8_8_ = (double)(puVar23 + local_158)[1] - auVar31._8_8_;
                            lVar21 = local_158;
                            goto LAB_0013cf32;
                          }
                          uVar51 = SUB84(local_218,0);
                          uVar52 = (undefined4)((ulong)local_218 >> 0x20);
                          local_348 = auVar59;
                          if (local_3e0 < 0.0) {
                            auVar48._8_8_ = sqrt(local_3e0);
                            uVar51 = SUB84(auVar48._8_8_,0);
                            uVar52 = (undefined4)((ulong)auVar48._8_8_ >> 0x20);
                          }
                          auVar59 = local_398._0_16_;
                          auVar48._8_8_ = local_78;
                          if ((double)local_148._0_8_ < 0.0) {
                            local_398._4_4_ = uVar52;
                            local_398._0_4_ = uVar51;
                            local_398._8_8_ = auVar59._8_8_;
                            auVar48._8_8_ = sqrt((double)local_148._0_8_);
                            uVar51 = local_398._0_4_;
                            uVar52 = local_398._4_4_;
                          }
                          auVar4._8_8_ = dStack_1a0;
                          auVar4._0_8_ = local_1a8;
                          dVar27 = (local_238 * (double)local_228._0_8_ +
                                   local_348._0_8_ * local_1a8) / (double)CONCAT44(uVar52,uVar51);
                          auVar32._8_8_ = auVar48._8_8_;
                          auVar32._0_8_ = auVar48._8_8_;
                          auVar59 = divpd(auVar4,auVar32);
                          auVar50._0_8_ = local_348._0_8_ - auVar59._0_8_ * dVar27;
                          auVar50._8_8_ = local_348._8_8_ - auVar59._8_8_ * dVar27;
                          auVar48._8_8_ =
                               auVar50._8_8_ * auVar50._8_8_ + auVar50._0_8_ * auVar50._0_8_;
                          if (auVar48._8_8_ < 0.0) {
                            local_348 = auVar50;
                            local_238 = dVar27;
                            auVar48._8_8_ = sqrt(auVar48._8_8_);
                            auVar50 = local_348;
                            dVar27 = local_238;
                          }
                          else {
                            auVar48._8_8_ = SQRT(auVar48._8_8_);
                          }
                          auVar33._8_8_ = auVar48._8_8_;
                          auVar33._0_8_ = auVar48._8_8_;
                          auVar59 = divpd(auVar50,auVar33);
                          dVar28 = (double)local_378._0_8_ * -2.0 * local_1c8;
                          auVar48._8_8_ = (dVar27 * dVar28) / (double)local_148._0_8_;
                          auVar46._0_8_ = auVar48._8_8_ * auVar59._0_8_;
                          auVar46._8_8_ = auVar48._8_8_ * auVar59._8_8_;
                          local_338._0_8_ = (double)local_338._0_8_ * (double)local_338._0_8_;
                          local_338._8_8_ = local_338._0_8_;
                          auVar31 = divpd(auVar46,local_338);
                          auVar48._8_8_ = (double)(puVar23 + local_150)[1];
                          puVar23[local_150] = (double)puVar23[local_150] + auVar31._0_8_;
                          (puVar23 + local_150)[1] = auVar48._8_8_ + auVar31._8_8_;
                          auVar48._8_8_ = local_218;
                          if (local_3e0 < 0.0) {
                            local_378._0_8_ = dVar28;
                            local_348 = auVar59;
                            auVar48._8_8_ = sqrt(local_3e0);
                            auVar59 = local_348;
                            dVar28 = (double)local_378._0_8_;
                          }
                          auVar48._8_8_ =
                               ((((dStack_40 - (double)local_1b8._8_8_) * local_68 +
                                 (local_48 - (double)local_1b8._0_8_) * local_138) / auVar48._8_8_)
                               * dVar28) / (double)local_148._0_8_;
                          auVar38._0_8_ = auVar48._8_8_ * auVar59._0_8_;
                          auVar38._8_8_ = auVar48._8_8_ * auVar59._8_8_;
                          auVar31 = divpd(auVar38,local_338);
                          auVar48._8_8_ = (double)(puVar23 + local_158)[1];
                          puVar23[local_158] = (double)puVar23[local_158] + auVar31._0_8_;
                          (puVar23 + local_158)[1] = auVar48._8_8_ + auVar31._8_8_;
                          auVar41._0_8_ = dVar28 * auVar59._0_8_;
                          auVar41._8_8_ = dVar28 * auVar59._8_8_;
                          auVar45 = local_338;
                        }
                        else {
                          auVar48._8_8_ =
                               auVar53._8_8_ * auVar53._8_8_ + auVar53._0_8_ * auVar53._0_8_;
                          dVar28 = SQRT(auVar48._8_8_);
                          uVar47 = 0;
                          auVar55._8_8_ = dVar28;
                          local_398._0_16_ = auVar53;
                          if (auVar48._8_8_ < 0.0) {
                            local_348._8_4_ = SUB84(auVar53._8_8_,0);
                            local_348._0_8_ = auVar48._8_8_;
                            local_348._12_4_ = (int)((ulong)auVar53._8_8_ >> 0x20);
                            dStack_230 = 0.0;
                            local_238 = dVar28;
                            dVar28 = sqrt(auVar48._8_8_);
                            auVar48._8_8_ = (double)local_348._0_8_;
                            auVar55._8_8_ = local_238;
                            uVar47 = extraout_XMM0_Qb_00;
                          }
                          dVar27 = (double)local_378._0_8_ * -2.0;
                          if (auVar48._8_8_ < 0.0) {
                            local_378._0_8_ = (double)local_378._0_8_ * -2.0;
                            local_348._8_8_ = uVar47;
                            local_348._0_8_ = dVar28;
                            auVar55._8_8_ = sqrt(auVar48._8_8_);
                            dVar28 = (double)local_348._0_8_;
                            dVar27 = (double)local_378._0_8_;
                          }
                          auVar44._8_8_ = dVar28;
                          auVar44._0_8_ = dVar28;
                          auVar59 = divpd(local_398._0_16_,auVar44);
                          dVar27 = dVar27 * local_1c8;
                          auVar45._0_8_ = (double)local_338._0_8_ * (double)local_338._0_8_;
                          auVar35._8_8_ = auVar55._8_8_;
                          auVar35._0_8_ = auVar55._8_8_;
                          auVar31 = divpd(local_398._0_16_,auVar35);
                          auVar54._0_8_ = auVar31._0_8_ * dVar27;
                          auVar54._8_8_ = auVar31._8_8_ * dVar27;
                          auVar45._8_8_ = auVar45._0_8_;
                          auVar31 = divpd(auVar54,auVar45);
                          auVar36._0_8_ = (double)puVar23[local_150] - auVar31._0_8_;
                          auVar36._8_8_ = (double)(puVar23 + local_150)[1] - auVar31._8_8_;
                          lVar21 = local_150;
LAB_0013cf32:
                          *(undefined1 (*) [16])(puVar23 + lVar21) = auVar36;
                          auVar41._0_8_ = dVar27 * auVar59._0_8_;
                          auVar41._8_8_ = dVar27 * auVar59._8_8_;
                        }
                        auVar59 = divpd(auVar41,auVar45);
                        auVar48._8_8_ = (double)(puVar23 + lVar14 * 2)[1];
                        puVar23[lVar14 * 2] = (double)puVar23[lVar14 * 2] + auVar59._0_8_;
                        (puVar23 + lVar14 * 2)[1] = auVar48._8_8_ + auVar59._8_8_;
                        auVar48._8_8_ = local_1d8;
                        dVar28 = local_328;
                        auVar7 = _local_3f8;
                      }
                    }
                    else {
                      *puVar23 = 0x7ff0000000000000;
                      auVar48._8_8_ = 0.0;
                      puVar12 = (undefined8 *)0x0;
                      local_248 = puVar23;
                      local_240 = dVar27;
                    }
                    _local_3f8 = auVar7;
                    if ((dVar28 == 0.0) && (!NAN(dVar28))) {
                      local_2bc = 1;
                      break;
                    }
                  }
                  _Var15._M_cur = (__node_type *)((_Var15._M_cur)->super__Hash_node_base)._M_nxt;
                  dVar27 = auVar48._8_8_;
                  puVar23 = puVar12;
                }
                auVar8._8_8_ = local_88;
                auVar8._0_8_ = local_80;
                iVar11 = local_2bc;
                if (bVar24) goto LAB_0013d1f0;
                uVar42 = (int)local_70 + 1;
              } while ((int)local_70 != local_2c0);
            }
            iVar11 = 0xc;
LAB_0013d1f0:
            auVar59 = auVar8;
            if (iVar11 != 0xc) goto LAB_0013d21a;
            iVar11 = (int)local_1f8;
            local_1f8 = (ulong)(iVar11 + 1);
          } while (iVar11 != local_1ec);
        }
        iVar11 = 9;
        auVar59 = auVar8;
LAB_0013d21a:
        this = local_320;
        auVar8 = auVar59;
        if (iVar11 == 9) {
          iVar11 = 0;
        }
      }
      else {
        iVar11 = 0;
      }
      local_88 = auVar8._8_8_;
      local_80 = auVar8._0_8_;
      local_3f8._0_8_ = auVar7._0_8_;
      if (iVar11 != 0) goto LAB_0013d275;
      local_3f8._8_4_ = auVar7._8_4_;
      iStack_3ec = auVar7._12_4_;
      stack0xfffffffffffffc10 = (_Type)CONCAT44(iStack_3ec,local_3f8._8_4_ + 1);
      if (iStack_3ec != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_3f8);
        auVar8._8_8_ = local_88;
        auVar8._0_8_ = local_80;
      }
      auVar7._8_8_ = stack0xfffffffffffffc10;
      auVar7._0_8_ = local_3f8._0_8_;
    } while (local_3f8._8_4_ != auVar59._8_4_ || local_3f8._0_8_ != auVar59._0_8_);
    iVar11 = 7;
LAB_0013d275:
    _local_3f8 = auVar7;
    *(undefined8 **)
     &(local_380->super_Mesh).
      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
      .super_PolyConnectivity = local_248;
    *(double *)
     &(local_380->super_Mesh).
      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
      .super_PolyConnectivity.field_0x8 = local_240;
    bVar24 = iVar11 == 7;
  }
  auVar31 = _local_3f8;
  if (bVar24) {
    *(undefined8 **)
     &(local_380->super_Mesh).
      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
      .super_PolyConnectivity = puVar12;
    *(double *)
     &(local_380->super_Mesh).
      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
      .super_PolyConnectivity.field_0x8 = auVar48._8_8_;
    puVar12 = (undefined8 *)0x0;
  }
LAB_0013d2b3:
  pMVar10 = local_380;
  local_88 = auVar8._8_8_;
  local_80 = auVar8._0_8_;
  _local_3f8 = auVar31;
  free(puVar12);
  tVar61.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  tVar61.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pMVar10;
  return (type)tVar61.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto calcGrad(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    // update the hashmap for computing the energy and gradient
    initHashMap(mesh, x, epsilon);
    // the energy term
    Eigen::VectorXd gradx(x.size());
    gradx.setZero();
    // the gradient for distortion term
    for (auto f: mesh.all_faces()) {
        Mesh::VertexHandle vs[3];
        int i = 0;
        for (auto itr = mesh.cfv_ccwbegin(f); itr != mesh.cfv_ccwend(f); itr++)
            vs[i++] = *itr;
        OpenMesh::Vec3d u0(x[2 * vs[0].idx()], x[2 * vs[0].idx() + 1], 0.0);
        OpenMesh::Vec3d u1(x[2 * vs[1].idx()], x[2 * vs[1].idx() + 1], 0.0);
        OpenMesh::Vec3d u2(x[2 * vs[2].idx()], x[2 * vs[2].idx() + 1], 0.0);
        OpenMesh::Vec3d ue1 = u1 - u0;
        OpenMesh::Vec3d ue2 = u2 - u0;

        OpenMesh::Vec3d p0(mesh.point(vs[0])[0], mesh.point(vs[0])[1], mesh.point(vs[0])[2]);
        OpenMesh::Vec3d p1(mesh.point(vs[1])[0], mesh.point(vs[1])[1], mesh.point(vs[1])[2]);
        OpenMesh::Vec3d p2(mesh.point(vs[2])[0], mesh.point(vs[2])[1], mesh.point(vs[2])[2]);
        OpenMesh::Vec3d pe1 = p1 - p0;
        OpenMesh::Vec3d pe2 = p2 - p0;

        // calculate the area of corresponding triangle
        double su = 0.5 * OpenMesh::cross(ue1, ue2).norm();
        if (su == 0.0) {
            gradx[0] = std::numeric_limits<double>::infinity();
            return std::move(gradx);
        }
        double sp = 0.5 * OpenMesh::cross(pe1, pe2).norm();

        double cot0 = OpenMesh::dot(p1 - p0, p2 - p0) / OpenMesh::cross(p1 - p0, p2 - p0).norm();
        double cot1 = OpenMesh::dot(p2 - p1, p0 - p1) / OpenMesh::cross(p2 - p1, p0 - p1).norm();
        double cot2 = OpenMesh::dot(p1 - p2, p0 - p2) / OpenMesh::cross(p1 - p2, p0 - p2).norm();
        
        double term1 = (1 + (sp * sp) / (su * su));
        double term2 = (sq(ue2.norm()) * sq(pe1.norm()) + sq(ue1.norm()) * sq(pe2.norm()) - 2.0f * dot(ue2, ue1) * dot(pe2, pe1)) / (4.0f * sp);

        {
            // dE / du0
            OpenMesh::Vec2d height(-(u2 - u1)[1], (u2 - u1)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u0 - u1) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du0 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du0 = -cot2 * u1 - cot1 * u2 + (cot1 + cot2) * u0;
            OpenMesh::Vec2d dE_du0 = dterm1_du0 * term2 + OpenMesh::Vec2d(dterm2_du0[0], dterm2_du0[1]) * term1; 
            gradx[vs[0].idx() * 2] += dE_du0[0];
            gradx[vs[0].idx() * 2 + 1] += dE_du0[1];
        }

        {
            // dE / du1
            OpenMesh::Vec2d height(-(u0 - u2)[1], (u0 - u2)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u1 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du1 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du1 = -cot2 * u0 - cot0 * u2 + (cot0 + cot2) * u1;
            OpenMesh::Vec2d dE_du1 = dterm1_du1 * term2 + OpenMesh::Vec2d(dterm2_du1[0], dterm2_du1[1]) * term1; 
            gradx[vs[1].idx() * 2] += dE_du1[0];
            gradx[vs[1].idx() * 2 + 1] += dE_du1[1];
        }

        {
            // dE / du2
            OpenMesh::Vec2d height(-(u1 - u0)[1], (u1 - u0)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u2 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du2 = -(sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du2 = -cot0 * u1 - cot1 * u0 + (cot0 + cot1) * u2;
            OpenMesh::Vec2d dE_du2 = dterm1_du2 * term2 + OpenMesh::Vec2d(dterm2_du2[0], dterm2_du2[1]) * term1; 
            gradx[vs[2].idx() * 2] += dE_du2[0];
            gradx[vs[2].idx() * 2 + 1] += dE_du2[1];
        }
    }

    int cnt = 0;
    // the singularity term
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            double seng = 0.0;
            int ui_idx = -1;

            int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            OpenMesh::Vec2d pst(x[2 * st], x[2 * st + 1]);
            OpenMesh::Vec2d pend(x[2 * end], x[2 * end + 1]);
            OpenMesh::Vec2d edge = pend - pst;

            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            OpenMesh::Vec2d point(x[itr->second * 2], x[itr->second * 2 + 1]);
                            double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));

                            if (dis == 0.0) {
                                gradx[0] = std::numeric_limits<double>::infinity();
                                return std::move(gradx);
                            }
                            seng = std::max(0.0, epsilon / dis - 1.0);
                            // calculate the gradient
                            ui_idx = itr->second;
                            if (ui_idx != -1 && seng != 0.0) {
                                OpenMesh::Vec2d grad_maxui;
                                OpenMesh::Vec2d grad_maxu1;
                                OpenMesh::Vec2d grad_maxu2;
                                OpenMesh::Vec2d ui(x[ui_idx * 2], x[ui_idx * 2 + 1]);
                                auto u1 = pst;
                                auto u2 = pend;
                                double dis = sqrt(OpenMesh::dot(ui - u1, ui - u1) - projected * projected);
                                
                                if (OpenMesh::dot(point - pend, pst - pend) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pend).normalize();
                                    OpenMesh::Vec2d dir_u2 = -(point - pend).normalize();
                                    
                                    // dE / du2
                                    gradx[end * 2] += -2.0 * seng * epsilon * dir_u2[0] / (dis * dis);
                                    gradx[end * 2 + 1] +=  -2.0 * seng * epsilon * dir_u2[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);
                                }
                                else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pst).normalize();
                                    OpenMesh::Vec2d dir_u1 = -(point - pst).normalize();

                                    // dE / du1
                                    gradx[st * 2] += -2.0 * seng * epsilon * dir_u1[0] / (dis * dis);
                                    gradx[st * 2 + 1] +=  -2.0 * seng * epsilon * dir_u1[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);

                                }
                                else {
                                    double projected = OpenMesh::dot(ui - u1, u2 - u1) / edge.norm();
                                    // the unit vector othorgonal to the edge
                                    auto normal = ui - u1 - (u2 - u1).normalize() * projected;
                                    normal = normal.normalize();
                                    // dE / du2 u2 is the end point of this edge
                                    grad_maxu2 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[end * 2] += grad_maxu2[0];
                                    gradx[end * 2 + 1] += grad_maxu2[1];
                                    // dE / du1 u1 is the start point of this edge
                                    projected = OpenMesh::dot(ui - u2, u1 - u2) / edge.norm();
                                    grad_maxu1 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[st * 2] += grad_maxu1[0];
                                    gradx[st * 2 + 1] += grad_maxu1[1];
                                    // dE / dui ui is the point with maximal distance
                                    grad_maxui = -2 * seng * epsilon * normal / (dis * dis);
                                    gradx[ui_idx * 2] += grad_maxui[0];
                                    gradx[ui_idx * 2 + 1] += grad_maxui[1];
                                }
                            }
                        }
                }
        }
    return std::move(gradx);
}